

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

bool __thiscall
duckdb::QuantileCompare<duckdb::MadAccessor<long,_long,_long>_>::operator()
          (QuantileCompare<duckdb::MadAccessor<long,_long,_long>_> *this,INPUT_TYPE *lhs,
          INPUT_TYPE *rhs)

{
  bool bVar1;
  OutOfRangeException *this_00;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  string local_48;
  
  uVar3 = *lhs - *this->accessor_l->median;
  uVar4 = *rhs - *this->accessor_r->median;
  if (uVar4 == 0x8000000000000000) {
    this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Overflow on abs(%d)","");
    OutOfRangeException::OutOfRangeException<long>(this_00,&local_48,-0x8000000000000000);
    __cxa_throw(this_00,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = -uVar3;
  if (0 < (long)uVar3) {
    uVar2 = uVar3;
  }
  uVar3 = -uVar4;
  if (0 < (long)uVar4) {
    uVar3 = uVar4;
  }
  bVar1 = uVar2 < uVar3;
  if (this->desc != false) {
    bVar1 = uVar3 < uVar2;
  }
  return bVar1;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}